

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeInfo.cpp
# Opt level: O0

bool __thiscall TypeInfo::testUnions(TypeInfo *this)

{
  bool bVar1;
  XMLCh *pXVar2;
  DOMElement *pDVar3;
  long *plVar4;
  XMLCh *pXVar5;
  ostream *poVar6;
  char *pcVar7;
  long lVar8;
  wchar16 *pwVar9;
  bool local_842;
  bool local_7b2;
  bool local_722;
  bool local_692;
  bool local_5f2;
  bool local_552;
  bool local_4b2;
  bool local_412;
  bool local_382;
  bool local_312;
  bool local_292;
  bool local_212;
  XStr local_1d8;
  XStr local_1d0;
  XStr local_1c8;
  XStr local_1c0;
  XStr local_1b8;
  XStr local_1b0;
  XStr local_1a8;
  XStr local_1a0;
  XStr local_198;
  XStr local_190;
  XStr local_188;
  XStr local_180;
  XStr local_178;
  XStr local_170;
  byte local_161;
  XStr local_160;
  XStr local_158;
  XStr local_150;
  XStr local_148;
  XStr local_140;
  byte local_131;
  XStr local_130;
  XStr local_128;
  XStr local_120;
  XStr local_118;
  XStr local_110;
  byte local_101;
  XStr local_100;
  XStr local_f8;
  XStr local_f0;
  XStr local_e8;
  XStr local_e0;
  byte local_d1;
  XStr local_d0;
  XStr local_c8;
  XStr local_c0;
  XStr local_b8;
  XStr local_b0;
  XStr local_a8;
  XStr local_a0;
  XStr local_98;
  XStr local_90;
  byte local_81;
  XStr local_80;
  XStr local_78;
  XStr local_70;
  XStr local_68;
  byte local_59;
  XStr local_58;
  XStr local_50 [3];
  XStr local_38;
  DOMElement *local_30;
  DOMElement *testEle;
  DOMAttr *testAttr;
  DOMNode *docEle;
  TypeInfo *pTStack_10;
  bool passed;
  TypeInfo *this_local;
  
  docEle._7_1_ = 1;
  pTStack_10 = this;
  testAttr = (DOMAttr *)(**(code **)(*(long *)this->doc + 0x68))();
  XStr::XStr(&local_38,"unionTest");
  pXVar2 = XStr::unicodeForm(&local_38);
  pDVar3 = findElement(this,pXVar2);
  XStr::~XStr(&local_38);
  local_30 = pDVar3;
  plVar4 = (long *)(**(code **)(*(long *)pDVar3 + 0x38))();
  local_30 = (DOMElement *)(**(code **)(*plVar4 + 0x50))();
  plVar4 = (long *)(**(code **)(*(long *)local_30 + 0x1d8))();
  pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x10))();
  XStr::XStr(local_50,"decimalDerivedType");
  local_59 = 0;
  pXVar5 = XStr::unicodeForm(local_50);
  bVar1 = xercesc_4_0::XMLString::equals(pXVar2,pXVar5);
  local_212 = false;
  if (bVar1) {
    plVar4 = (long *)(**(code **)(*(long *)local_30 + 0x1d8))();
    pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x18))();
    XStr::XStr(&local_58,"");
    local_59 = 1;
    pXVar5 = XStr::unicodeForm(&local_58);
    local_212 = xercesc_4_0::XMLString::equals(pXVar2,pXVar5);
  }
  tmp = local_212;
  if ((local_59 & 1) != 0) {
    XStr::~XStr(&local_58);
  }
  XStr::~XStr(local_50);
  if ((tmp & 1U) == 0) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1f1);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    XStr::XStr(&local_68,"decimalDerivedType");
    pXVar2 = XStr::unicodeForm(&local_68);
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               (pXVar2,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    XStr::XStr(&local_70,"");
    pXVar2 = XStr::unicodeForm(&local_70);
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               (pXVar2,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    XStr::~XStr(&local_70);
    XStr::~XStr(&local_68);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar4 = (long *)(**(code **)(*(long *)local_30 + 0x1d8))();
    lVar8 = (**(code **)(*plVar4 + 0x10))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*(long *)local_30 + 0x1d8))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x10))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar4 = (long *)(**(code **)(*(long *)local_30 + 0x1d8))();
    lVar8 = (**(code **)(*plVar4 + 0x18))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*(long *)local_30 + 0x1d8))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    docEle._7_1_ = 0;
  }
  plVar4 = (long *)(**(code **)(*(long *)local_30 + 0x50))();
  local_30 = (DOMElement *)(**(code **)(*plVar4 + 0x50))();
  plVar4 = (long *)(**(code **)(*(long *)local_30 + 0x1d8))();
  pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x10))();
  XStr::XStr(&local_78,"stringDerivedType");
  local_81 = 0;
  pXVar5 = XStr::unicodeForm(&local_78);
  bVar1 = xercesc_4_0::XMLString::equals(pXVar2,pXVar5);
  local_292 = false;
  if (bVar1) {
    plVar4 = (long *)(**(code **)(*(long *)local_30 + 0x1d8))();
    pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x18))();
    XStr::XStr(&local_80,"");
    local_81 = 1;
    pXVar5 = XStr::unicodeForm(&local_80);
    local_292 = xercesc_4_0::XMLString::equals(pXVar2,pXVar5);
  }
  tmp = local_292;
  if ((local_81 & 1) != 0) {
    XStr::~XStr(&local_80);
  }
  XStr::~XStr(&local_78);
  if ((tmp & 1U) == 0) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,500);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    XStr::XStr(&local_90,"stringDerivedType");
    pXVar2 = XStr::unicodeForm(&local_90);
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               (pXVar2,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    XStr::XStr(&local_98,"");
    pXVar2 = XStr::unicodeForm(&local_98);
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               (pXVar2,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    XStr::~XStr(&local_98);
    XStr::~XStr(&local_90);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar4 = (long *)(**(code **)(*(long *)local_30 + 0x1d8))();
    lVar8 = (**(code **)(*plVar4 + 0x10))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*(long *)local_30 + 0x1d8))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x10))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar4 = (long *)(**(code **)(*(long *)local_30 + 0x1d8))();
    lVar8 = (**(code **)(*plVar4 + 0x18))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*(long *)local_30 + 0x1d8))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    docEle._7_1_ = 0;
  }
  plVar4 = (long *)(**(code **)(*(long *)local_30 + 0x50))();
  local_30 = (DOMElement *)(**(code **)(*plVar4 + 0x50))();
  plVar4 = (long *)(**(code **)(*(long *)local_30 + 0x1d8))();
  pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x10))();
  XStr::XStr(&local_a0,"decimal");
  pXVar5 = XStr::unicodeForm(&local_a0);
  bVar1 = xercesc_4_0::XMLString::equals(pXVar2,pXVar5);
  local_312 = false;
  if (bVar1) {
    plVar4 = (long *)(**(code **)(*(long *)local_30 + 0x1d8))();
    pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x18))();
    local_312 = xercesc_4_0::XMLString::equals
                          (pXVar2,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
  }
  tmp = local_312;
  XStr::~XStr(&local_a0);
  if ((tmp & 1U) == 0) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1f7);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    XStr::XStr(&local_a8,"decimal");
    pXVar2 = XStr::unicodeForm(&local_a8);
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               (pXVar2,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    XStr::~XStr(&local_a8);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar4 = (long *)(**(code **)(*(long *)local_30 + 0x1d8))();
    lVar8 = (**(code **)(*plVar4 + 0x10))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*(long *)local_30 + 0x1d8))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x10))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar4 = (long *)(**(code **)(*(long *)local_30 + 0x1d8))();
    lVar8 = (**(code **)(*plVar4 + 0x18))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*(long *)local_30 + 0x1d8))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    docEle._7_1_ = 0;
  }
  plVar4 = (long *)(**(code **)(*(long *)local_30 + 0x50))();
  local_30 = (DOMElement *)(**(code **)(*plVar4 + 0x50))();
  plVar4 = (long *)(**(code **)(*(long *)local_30 + 0x1d8))();
  pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x10))();
  XStr::XStr(&local_b0,"string");
  pXVar5 = XStr::unicodeForm(&local_b0);
  bVar1 = xercesc_4_0::XMLString::equals(pXVar2,pXVar5);
  local_382 = false;
  if (bVar1) {
    plVar4 = (long *)(**(code **)(*(long *)local_30 + 0x1d8))();
    pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x18))();
    local_382 = xercesc_4_0::XMLString::equals
                          (pXVar2,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
  }
  tmp = local_382;
  XStr::~XStr(&local_b0);
  if ((tmp & 1U) == 0) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1fa);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    XStr::XStr(&local_b8,"string");
    pXVar2 = XStr::unicodeForm(&local_b8);
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               (pXVar2,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    XStr::~XStr(&local_b8);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar4 = (long *)(**(code **)(*(long *)local_30 + 0x1d8))();
    lVar8 = (**(code **)(*plVar4 + 0x10))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*(long *)local_30 + 0x1d8))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x10))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar4 = (long *)(**(code **)(*(long *)local_30 + 0x1d8))();
    lVar8 = (**(code **)(*plVar4 + 0x18))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*(long *)local_30 + 0x1d8))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    docEle._7_1_ = 0;
  }
  plVar4 = (long *)(**(code **)(*(long *)local_30 + 0x50))();
  plVar4 = (long *)(**(code **)(*plVar4 + 0x50))();
  local_30 = (DOMElement *)plVar4;
  XStr::XStr(&local_c0,"testAttr");
  pXVar2 = XStr::unicodeForm(&local_c0);
  testEle = (DOMElement *)(**(code **)(*plVar4 + 0x198))(plVar4,0,pXVar2);
  XStr::~XStr(&local_c0);
  plVar4 = (long *)(**(code **)(*(long *)testEle + 0x170))();
  pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x10))();
  XStr::XStr(&local_c8,"decimalDerivedType");
  local_d1 = 0;
  pXVar5 = XStr::unicodeForm(&local_c8);
  bVar1 = xercesc_4_0::XMLString::equals(pXVar2,pXVar5);
  local_412 = false;
  if (bVar1) {
    plVar4 = (long *)(**(code **)(*(long *)testEle + 0x170))();
    pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x18))();
    XStr::XStr(&local_d0,"");
    local_d1 = 1;
    pXVar5 = XStr::unicodeForm(&local_d0);
    local_412 = xercesc_4_0::XMLString::equals(pXVar2,pXVar5);
  }
  tmp = local_412;
  if ((local_d1 & 1) != 0) {
    XStr::~XStr(&local_d0);
  }
  XStr::~XStr(&local_c8);
  if ((tmp & 1U) == 0) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1fe);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    XStr::XStr(&local_e0,"decimalDerivedType");
    pXVar2 = XStr::unicodeForm(&local_e0);
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               (pXVar2,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    XStr::XStr(&local_e8,"");
    pXVar2 = XStr::unicodeForm(&local_e8);
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               (pXVar2,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    XStr::~XStr(&local_e8);
    XStr::~XStr(&local_e0);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar4 = (long *)(**(code **)(*(long *)testEle + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x10))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*(long *)testEle + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x10))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar4 = (long *)(**(code **)(*(long *)testEle + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x18))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*(long *)testEle + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    docEle._7_1_ = 0;
  }
  pDVar3 = local_30;
  XStr::XStr(&local_f0,"testAttr2");
  pXVar2 = XStr::unicodeForm(&local_f0);
  testEle = (DOMElement *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,0,pXVar2);
  XStr::~XStr(&local_f0);
  plVar4 = (long *)(**(code **)(*(long *)testEle + 0x170))();
  pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x10))();
  XStr::XStr(&local_f8,"stringDerivedType");
  local_101 = 0;
  pXVar5 = XStr::unicodeForm(&local_f8);
  bVar1 = xercesc_4_0::XMLString::equals(pXVar2,pXVar5);
  local_4b2 = false;
  if (bVar1) {
    plVar4 = (long *)(**(code **)(*(long *)testEle + 0x170))();
    pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x18))();
    XStr::XStr(&local_100,"");
    local_101 = 1;
    pXVar5 = XStr::unicodeForm(&local_100);
    local_4b2 = xercesc_4_0::XMLString::equals(pXVar2,pXVar5);
  }
  tmp = local_4b2;
  if ((local_101 & 1) != 0) {
    XStr::~XStr(&local_100);
  }
  XStr::~XStr(&local_f8);
  if ((tmp & 1U) == 0) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x200);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    XStr::XStr(&local_110,"stringDerivedType");
    pXVar2 = XStr::unicodeForm(&local_110);
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               (pXVar2,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    XStr::XStr(&local_118,"");
    pXVar2 = XStr::unicodeForm(&local_118);
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               (pXVar2,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    XStr::~XStr(&local_118);
    XStr::~XStr(&local_110);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar4 = (long *)(**(code **)(*(long *)testEle + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x10))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*(long *)testEle + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x10))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar4 = (long *)(**(code **)(*(long *)testEle + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x18))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*(long *)testEle + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    docEle._7_1_ = 0;
  }
  plVar4 = (long *)(**(code **)(*(long *)local_30 + 0x50))();
  plVar4 = (long *)(**(code **)(*plVar4 + 0x50))();
  local_30 = (DOMElement *)plVar4;
  XStr::XStr(&local_120,"testAttr");
  pXVar2 = XStr::unicodeForm(&local_120);
  testEle = (DOMElement *)(**(code **)(*plVar4 + 0x198))(plVar4,0,pXVar2);
  XStr::~XStr(&local_120);
  plVar4 = (long *)(**(code **)(*(long *)testEle + 0x170))();
  pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x10))();
  XStr::XStr(&local_128,"stringDerivedType");
  local_131 = 0;
  pXVar5 = XStr::unicodeForm(&local_128);
  bVar1 = xercesc_4_0::XMLString::equals(pXVar2,pXVar5);
  local_552 = false;
  if (bVar1) {
    plVar4 = (long *)(**(code **)(*(long *)testEle + 0x170))();
    pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x18))();
    XStr::XStr(&local_130,"");
    local_131 = 1;
    pXVar5 = XStr::unicodeForm(&local_130);
    local_552 = xercesc_4_0::XMLString::equals(pXVar2,pXVar5);
  }
  tmp = local_552;
  if ((local_131 & 1) != 0) {
    XStr::~XStr(&local_130);
  }
  XStr::~XStr(&local_128);
  if ((tmp & 1U) == 0) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x204);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    XStr::XStr(&local_140,"stringDerivedType");
    pXVar2 = XStr::unicodeForm(&local_140);
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               (pXVar2,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    XStr::XStr(&local_148,"");
    pXVar2 = XStr::unicodeForm(&local_148);
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               (pXVar2,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    XStr::~XStr(&local_148);
    XStr::~XStr(&local_140);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar4 = (long *)(**(code **)(*(long *)testEle + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x10))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*(long *)testEle + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x10))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar4 = (long *)(**(code **)(*(long *)testEle + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x18))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*(long *)testEle + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    docEle._7_1_ = 0;
  }
  pDVar3 = local_30;
  XStr::XStr(&local_150,"testAttr2");
  pXVar2 = XStr::unicodeForm(&local_150);
  testEle = (DOMElement *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,0,pXVar2);
  XStr::~XStr(&local_150);
  plVar4 = (long *)(**(code **)(*(long *)testEle + 0x170))();
  pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x10))();
  XStr::XStr(&local_158,"decimalDerivedType");
  local_161 = 0;
  pXVar5 = XStr::unicodeForm(&local_158);
  bVar1 = xercesc_4_0::XMLString::equals(pXVar2,pXVar5);
  local_5f2 = false;
  if (bVar1) {
    plVar4 = (long *)(**(code **)(*(long *)testEle + 0x170))();
    pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x18))();
    XStr::XStr(&local_160,"");
    local_161 = 1;
    pXVar5 = XStr::unicodeForm(&local_160);
    local_5f2 = xercesc_4_0::XMLString::equals(pXVar2,pXVar5);
  }
  tmp = local_5f2;
  if ((local_161 & 1) != 0) {
    XStr::~XStr(&local_160);
  }
  XStr::~XStr(&local_158);
  if ((tmp & 1U) == 0) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x206);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    XStr::XStr(&local_170,"decimalDerivedType");
    pXVar2 = XStr::unicodeForm(&local_170);
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               (pXVar2,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    XStr::XStr(&local_178,"");
    pXVar2 = XStr::unicodeForm(&local_178);
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               (pXVar2,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    XStr::~XStr(&local_178);
    XStr::~XStr(&local_170);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar4 = (long *)(**(code **)(*(long *)testEle + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x10))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*(long *)testEle + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x10))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar4 = (long *)(**(code **)(*(long *)testEle + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x18))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*(long *)testEle + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    docEle._7_1_ = 0;
  }
  plVar4 = (long *)(**(code **)(*(long *)local_30 + 0x50))();
  plVar4 = (long *)(**(code **)(*plVar4 + 0x50))();
  local_30 = (DOMElement *)plVar4;
  XStr::XStr(&local_180,"testAttr");
  pXVar2 = XStr::unicodeForm(&local_180);
  testEle = (DOMElement *)(**(code **)(*plVar4 + 0x198))(plVar4,0,pXVar2);
  XStr::~XStr(&local_180);
  plVar4 = (long *)(**(code **)(*(long *)testEle + 0x170))();
  pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x10))();
  XStr::XStr(&local_188,"decimal");
  pXVar5 = XStr::unicodeForm(&local_188);
  bVar1 = xercesc_4_0::XMLString::equals(pXVar2,pXVar5);
  local_692 = false;
  if (bVar1) {
    plVar4 = (long *)(**(code **)(*(long *)testEle + 0x170))();
    pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x18))();
    local_692 = xercesc_4_0::XMLString::equals
                          (pXVar2,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
  }
  tmp = local_692;
  XStr::~XStr(&local_188);
  if ((tmp & 1U) == 0) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x20a);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    XStr::XStr(&local_190,"decimal");
    pXVar2 = XStr::unicodeForm(&local_190);
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               (pXVar2,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    XStr::~XStr(&local_190);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar4 = (long *)(**(code **)(*(long *)testEle + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x10))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*(long *)testEle + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x10))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar4 = (long *)(**(code **)(*(long *)testEle + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x18))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*(long *)testEle + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    docEle._7_1_ = 0;
  }
  pDVar3 = local_30;
  XStr::XStr(&local_198,"testAttr2");
  pXVar2 = XStr::unicodeForm(&local_198);
  testEle = (DOMElement *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,0,pXVar2);
  XStr::~XStr(&local_198);
  plVar4 = (long *)(**(code **)(*(long *)testEle + 0x170))();
  pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x10))();
  XStr::XStr(&local_1a0,"string");
  pXVar5 = XStr::unicodeForm(&local_1a0);
  bVar1 = xercesc_4_0::XMLString::equals(pXVar2,pXVar5);
  local_722 = false;
  if (bVar1) {
    plVar4 = (long *)(**(code **)(*(long *)testEle + 0x170))();
    pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x18))();
    local_722 = xercesc_4_0::XMLString::equals
                          (pXVar2,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
  }
  tmp = local_722;
  XStr::~XStr(&local_1a0);
  if ((tmp & 1U) == 0) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x20c);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    XStr::XStr(&local_1a8,"string");
    pXVar2 = XStr::unicodeForm(&local_1a8);
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               (pXVar2,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    XStr::~XStr(&local_1a8);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar4 = (long *)(**(code **)(*(long *)testEle + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x10))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*(long *)testEle + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x10))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar4 = (long *)(**(code **)(*(long *)testEle + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x18))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*(long *)testEle + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    docEle._7_1_ = 0;
  }
  plVar4 = (long *)(**(code **)(*(long *)local_30 + 0x50))();
  plVar4 = (long *)(**(code **)(*plVar4 + 0x50))();
  local_30 = (DOMElement *)plVar4;
  XStr::XStr(&local_1b0,"testAttr");
  pXVar2 = XStr::unicodeForm(&local_1b0);
  testEle = (DOMElement *)(**(code **)(*plVar4 + 0x198))(plVar4,0,pXVar2);
  XStr::~XStr(&local_1b0);
  plVar4 = (long *)(**(code **)(*(long *)testEle + 0x170))();
  pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x10))();
  XStr::XStr(&local_1b8,"string");
  pXVar5 = XStr::unicodeForm(&local_1b8);
  bVar1 = xercesc_4_0::XMLString::equals(pXVar2,pXVar5);
  local_7b2 = false;
  if (bVar1) {
    plVar4 = (long *)(**(code **)(*(long *)testEle + 0x170))();
    pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x18))();
    local_7b2 = xercesc_4_0::XMLString::equals
                          (pXVar2,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
  }
  tmp = local_7b2;
  XStr::~XStr(&local_1b8);
  if ((tmp & 1U) == 0) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x210);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    XStr::XStr(&local_1c0,"string");
    pXVar2 = XStr::unicodeForm(&local_1c0);
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               (pXVar2,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    XStr::~XStr(&local_1c0);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar4 = (long *)(**(code **)(*(long *)testEle + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x10))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*(long *)testEle + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x10))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar4 = (long *)(**(code **)(*(long *)testEle + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x18))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*(long *)testEle + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    docEle._7_1_ = 0;
  }
  pDVar3 = local_30;
  XStr::XStr(&local_1c8,"testAttr2");
  pXVar2 = XStr::unicodeForm(&local_1c8);
  testEle = (DOMElement *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,0,pXVar2);
  XStr::~XStr(&local_1c8);
  plVar4 = (long *)(**(code **)(*(long *)testEle + 0x170))();
  pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x10))();
  XStr::XStr(&local_1d0,"decimal");
  pXVar5 = XStr::unicodeForm(&local_1d0);
  bVar1 = xercesc_4_0::XMLString::equals(pXVar2,pXVar5);
  local_842 = false;
  if (bVar1) {
    plVar4 = (long *)(**(code **)(*(long *)testEle + 0x170))();
    pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x18))();
    local_842 = xercesc_4_0::XMLString::equals
                          (pXVar2,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
  }
  tmp = local_842;
  XStr::~XStr(&local_1d0);
  if ((tmp & 1U) == 0) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x212);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    XStr::XStr(&local_1d8,"decimal");
    pXVar2 = XStr::unicodeForm(&local_1d8);
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               (pXVar2,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    XStr::~XStr(&local_1d8);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar4 = (long *)(**(code **)(*(long *)testEle + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x10))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*(long *)testEle + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x10))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar4 = (long *)(**(code **)(*(long *)testEle + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x18))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*(long *)testEle + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    docEle._7_1_ = 0;
  }
  return (bool)(docEle._7_1_ & 1);
}

Assistant:

bool TypeInfo::testUnions() {

    bool passed = true;
    DOMNode *docEle = doc->getDocumentElement();
    UNUSED(docEle); // silence warning
    DOMAttr *testAttr;

    //element unionTest
    DOMElement *testEle = findElement(X("unionTest"));

    testEle = (DOMElement *)testEle->getFirstChild()->getNextSibling();
    DOMTYPEINFOTEST(testEle->getSchemaTypeInfo(), X("decimalDerivedType"), X(""), __LINE__);

    testEle = (DOMElement *)testEle->getNextSibling()->getNextSibling();
    DOMTYPEINFOTEST(testEle->getSchemaTypeInfo(), X("stringDerivedType"), X(""), __LINE__);

    testEle = (DOMElement *)testEle->getNextSibling()->getNextSibling();
    DOMTYPEINFOTEST(testEle->getSchemaTypeInfo(), X("decimal"), SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testEle = (DOMElement *)testEle->getNextSibling()->getNextSibling();
    DOMTYPEINFOTEST(testEle->getSchemaTypeInfo(), X("string"), SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testEle = (DOMElement *)testEle->getNextSibling()->getNextSibling();
    testAttr = testEle->getAttributeNodeNS(0, X("testAttr"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), X("decimalDerivedType"), X(""), __LINE__);
    testAttr = testEle->getAttributeNodeNS(0, X("testAttr2"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), X("stringDerivedType"), X(""), __LINE__);

    testEle = (DOMElement *)testEle->getNextSibling()->getNextSibling();
    testAttr = testEle->getAttributeNodeNS(0, X("testAttr"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), X("stringDerivedType"), X(""), __LINE__);
    testAttr = testEle->getAttributeNodeNS(0, X("testAttr2"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), X("decimalDerivedType"), X(""), __LINE__);

    testEle = (DOMElement *)testEle->getNextSibling()->getNextSibling();
    testAttr = testEle->getAttributeNodeNS(0, X("testAttr"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), X("decimal"), SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);
    testAttr = testEle->getAttributeNodeNS(0, X("testAttr2"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), X("string"), SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testEle = (DOMElement *)testEle->getNextSibling()->getNextSibling();
    testAttr = testEle->getAttributeNodeNS(0, X("testAttr"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), X("string"), SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);
    testAttr = testEle->getAttributeNodeNS(0, X("testAttr2"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), X("decimal"), SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    return passed;

}